

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O0

void Ssc_GiaClassesInit(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Rpr_t *pGVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  bool bVar6;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    iVar1 = Gia_ManObjNum(p);
    pGVar3 = (Gia_Rpr_t *)calloc((long)iVar1,4);
    p->pReprs = pGVar3;
    iVar1 = Gia_ManObjNum(p);
    piVar4 = (int *)calloc((long)iVar1,4);
    p->pNexts = piVar4;
    local_1c = 0;
    while( true ) {
      bVar6 = false;
      if (local_1c < p->nObjs) {
        pGStack_18 = Gia_ManObj(p,local_1c);
        bVar6 = pGStack_18 != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar2 = Gia_ObjIsCand(pGStack_18);
      iVar1 = 0xfffffff;
      if (iVar2 != 0) {
        iVar1 = 0;
      }
      Gia_ObjSetRepr(p,local_1c,iVar1);
      local_1c = local_1c + 1;
    }
    if (p->vClassOld == (Vec_Int_t *)0x0) {
      pVVar5 = Vec_IntAlloc(100);
      p->vClassOld = pVVar5;
    }
    if (p->vClassNew == (Vec_Int_t *)0x0) {
      pVVar5 = Vec_IntAlloc(100);
      p->vClassNew = pVVar5;
    }
    return;
  }
  __assert_fail("p->pReprs == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                ,0x10d,"void Ssc_GiaClassesInit(Gia_Man_t *)");
}

Assistant:

void Ssc_GiaClassesInit( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pReprs == NULL );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    p->pNexts = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
        Gia_ObjSetRepr( p, i, Gia_ObjIsCand(pObj) ? 0 : GIA_VOID );
    if ( p->vClassOld == NULL )
        p->vClassOld = Vec_IntAlloc( 100 );
    if ( p->vClassNew == NULL )
        p->vClassNew = Vec_IntAlloc( 100 );
}